

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QLayoutItem * __thiscall QMainWindowLayout::takeAt(QMainWindowLayout *this,int index)

{
  QMainWindowLayoutState *this_00;
  QArrayDataPointer<int> *this_01;
  QLayoutItem *pQVar1;
  int iVar2;
  QLayoutItem *ret;
  QLayoutItem *__filename;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QRect QVar3;
  QArrayDataPointer<int> QStack_58;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  this_00 = (QMainWindowLayoutState *)(this + 0x88);
  __filename = QMainWindowLayoutState::takeAt(this_00,index,&local_3c);
  if (__filename == (QLayoutItem *)0x0) {
    pQVar1 = *(QLayoutItem **)(this + 0x708);
    __filename = (QLayoutItem *)0x0;
    if ((pQVar1 != (QLayoutItem *)0x0) && (local_3c == index)) {
      *(undefined8 *)(this + 0x708) = 0;
      __filename = pQVar1;
    }
  }
  else {
    iVar2 = (*__filename->_vptr_QLayoutItem[0xd])(__filename);
    if (CONCAT44(extraout_var,iVar2) != 0) {
      QWidgetAnimator::abort((QWidgetAnimator *)(this + 0x790));
      if (CONCAT44(extraout_var,iVar2) == *(long *)(this + 0x7d8)) {
        *(undefined8 *)(this + 0x7d8) = 0;
      }
    }
    if ((*(int *)(this + 0x3c0) <= *(int *)(this + 0x3c8)) &&
       (*(int *)(this + 0x3c4) <= *(int *)(this + 0x3cc))) {
      QMainWindowLayoutState::remove((QMainWindowLayoutState *)(this + 0x3c0),(char *)__filename);
      QMainWindowLayoutState::remove(this_00,(char *)__filename);
    }
    if ((*(long *)(this + 0x7c0) != 0) && (**(int **)(this + 0x7b8) == 0)) {
      this_01 = (QArrayDataPointer<int> *)(this + 0x7b0);
      QToolBarAreaLayout::currentGapIndex
                ((QList<int> *)&QStack_58,(QToolBarAreaLayout *)(this + 0xa0));
      QArrayDataPointer<int>::operator=(this_01,&QStack_58);
      QArrayDataPointer<int>::~QArrayDataPointer(&QStack_58);
      if (*(long *)(this + 0x7c0) != 0) {
        QList<int>::prepend((QList<int> *)this_01,0);
        QVar3 = QMainWindowLayoutState::itemRect(this_00,(QList<int> *)this_01);
        *(QRect *)(this + 0x7c8) = QVar3;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __filename;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QMainWindowLayout::takeAt(int index)
{
    int x = 0;

    if (QLayoutItem *ret = layoutState.takeAt(index, &x)) {
        // the widget might in fact have been destroyed by now
        if (QWidget *w = ret->widget()) {
            widgetAnimator.abort(w);
            if (w == pluggingWidget)
                pluggingWidget = nullptr;
        }

        if (savedState.isValid() ) {
            //we need to remove the item also from the saved state to prevent crash
            savedState.remove(ret);
            //Also, the item may be contained several times as a gap item.
            layoutState.remove(ret);
        }

#if QT_CONFIG(toolbar)
        if (!currentGapPos.isEmpty() && currentGapPos.constFirst() == 0) {
            currentGapPos = layoutState.toolBarAreaLayout.currentGapIndex();
            if (!currentGapPos.isEmpty()) {
                currentGapPos.prepend(0);
                currentGapRect = layoutState.itemRect(currentGapPos);
            }
        }
#endif

        return ret;
    }

    if (statusbar && x++ == index) {
        QLayoutItem *ret = statusbar;
        statusbar = nullptr;
        return ret;
    }

    return nullptr;
}